

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckedArithmetic.h
# Opt level: O1

size_t Imf_2_5::checkArraySize<unsigned_long>(unsigned_long n,size_t s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  OverflowExc *this;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = s;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = n;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    return n;
  }
  this = (OverflowExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::OverflowExc::OverflowExc(this,"Integer multiplication overflow.");
  __cxa_throw(this,&Iex_2_5::OverflowExc::typeinfo,Iex_2_5::OverflowExc::~OverflowExc);
}

Assistant:

size_t
checkArraySize (T n, size_t s)
{
    //
    // Verify that the size, in bytes, of an array with n elements
    // of size s can be computed without overflowing:
    //
    // If computing
    //
    //      size_t (n) * s
    //
    // would overflow, then throw an IEX_NAMESPACE::OverflowExc exception.
    // Otherwise return
    //
    //      size_t (n).
    //

    IMF_STATIC_ASSERT (!std::numeric_limits<T>::is_signed &&
                        std::numeric_limits<T>::is_integer);

    IMF_STATIC_ASSERT (sizeof (T) <= sizeof (size_t));

    if (size_t (n) > std::numeric_limits<size_t>::max() / s)
        throw IEX_NAMESPACE::OverflowExc ("Integer multiplication overflow.");

    return size_t (n);
}